

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O2

void brotli::HistogramCombine<brotli::Histogram<256>>
               (Histogram<256> *out,uint32_t *cluster_size,uint32_t *symbols,size_t symbols_size,
               size_t max_clusters)

{
  HistogramPair *p2;
  pointer pHVar1;
  uint idx1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  double dVar8;
  double dVar9;
  uint32_t uVar10;
  bool bVar11;
  size_t i;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var12;
  pointer puVar13;
  size_t sVar14;
  pointer puVar15;
  size_t __n;
  size_type __new_size;
  ulong uVar16;
  long lVar17;
  size_t i_1;
  ulong uVar18;
  size_t i_2;
  ulong uVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> clusters;
  vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> pairs;
  double local_70;
  ulong local_68;
  HistogramPair front;
  
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&clusters,symbols,
             symbols + symbols_size,(allocator_type *)&pairs);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  _Var12 = std::
           __unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&clusters,
             (long)_Var12._M_current -
             (long)clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar13 = clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar15 = clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar18 = 0;
  while (uVar19 = uVar18, uVar19 < (ulong)((long)puVar15 - (long)puVar13 >> 2)) {
    for (uVar16 = uVar19 + 1; uVar18 = uVar19 + 1,
        uVar16 < (ulong)((long)puVar15 - (long)puVar13 >> 2); uVar16 = uVar16 + 1) {
      CompareAndPushToQueue<brotli::Histogram<256>>
                (out,cluster_size,puVar13[uVar19],puVar13[uVar16],&pairs);
      puVar13 = clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar15 = clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  local_70 = 0.0;
  local_68 = 1;
  do {
    while( true ) {
      if ((ulong)((long)puVar15 - (long)puVar13 >> 2) <= local_68) {
        std::_Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::
        ~_Vector_base(&pairs.
                       super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                     );
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        return;
      }
      if ((pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
           _M_impl.super__Vector_impl_data._M_start)->cost_diff < local_70) break;
      local_70 = 1e+99;
      local_68 = max_clusters;
    }
    idx1 = (pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
            _M_impl.super__Vector_impl_data._M_start)->idx1;
    uVar2 = (pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
             ._M_impl.super__Vector_impl_data._M_start)->idx2;
    Histogram<256>::AddHistogram(out + idx1,out + uVar2);
    out[idx1].bit_cost_ =
         (pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
          _M_impl.super__Vector_impl_data._M_start)->cost_combo;
    cluster_size[idx1] = cluster_size[idx1] + cluster_size[uVar2];
    for (sVar14 = 0; symbols_size != sVar14; sVar14 = sVar14 + 1) {
      if (symbols[sVar14] == uVar2) {
        symbols[sVar14] = idx1;
      }
    }
    __n = (long)clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    for (puVar13 = clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start; __n = __n - 4,
        puVar13 !=
        clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish; puVar13 = puVar13 + 1) {
      if (uVar2 <= *puVar13) {
        if (puVar13 + 1 !=
            clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memmove(puVar13,puVar13 + 1,__n);
        }
        clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        break;
      }
    }
    lVar17 = 0;
    __new_size = 0;
    for (uVar18 = 0;
        uVar18 < (ulong)(((long)pairs.
                                super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)pairs.
                               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar18 = uVar18 + 1) {
      uVar3 = *(uint *)((long)&(pairs.
                                super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                ._M_impl.super__Vector_impl_data._M_start)->idx1 + lVar17);
      if ((((uVar3 != idx1) &&
           (uVar4 = *(uint *)((long)&(pairs.
                                      super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->idx2 + lVar17),
           uVar4 != uVar2)) && (uVar3 != uVar2)) && (uVar4 != idx1)) {
        p2 = (HistogramPair *)
             ((long)&(pairs.
                      super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                      ._M_impl.super__Vector_impl_data._M_start)->idx1 + lVar17);
        bVar11 = operator<(pairs.
                           super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                           ._M_impl.super__Vector_impl_data._M_start,p2);
        if (bVar11) {
          dVar5 = (pairs.
                   super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                   ._M_impl.super__Vector_impl_data._M_start)->cost_diff;
          uVar6 = (pairs.
                   super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                   ._M_impl.super__Vector_impl_data._M_start)->idx1;
          uVar7 = (pairs.
                   super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                   ._M_impl.super__Vector_impl_data._M_start)->idx2;
          dVar8 = (pairs.
                   super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                   ._M_impl.super__Vector_impl_data._M_start)->cost_combo;
          uVar10 = p2->idx2;
          dVar9 = p2->cost_combo;
          (pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
           _M_impl.super__Vector_impl_data._M_start)->idx1 = p2->idx1;
          (pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
           _M_impl.super__Vector_impl_data._M_start)->idx2 = uVar10;
          (pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
           _M_impl.super__Vector_impl_data._M_start)->cost_combo = dVar9;
          (pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
           _M_impl.super__Vector_impl_data._M_start)->cost_diff = p2->cost_diff;
          pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
          _M_impl.super__Vector_impl_data._M_start[__new_size].cost_diff = dVar5;
          front.cost_combo._0_4_ = SUB84(dVar8,0);
          front.cost_combo._4_4_ = (undefined4)((ulong)dVar8 >> 0x20);
        }
        else {
          pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
          _M_impl.super__Vector_impl_data._M_start[__new_size].cost_diff = p2->cost_diff;
          uVar6 = p2->idx1;
          uVar7 = p2->idx2;
          front.cost_combo._0_4_ = *(undefined4 *)&p2->cost_combo;
          front.cost_combo._4_4_ = *(undefined4 *)((long)&p2->cost_combo + 4);
        }
        pHVar1 = pairs.
                 super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
                 _M_impl.super__Vector_impl_data._M_start + __new_size;
        pHVar1->idx1 = uVar6;
        pHVar1->idx2 = uVar7;
        *(undefined4 *)&pHVar1->cost_combo = front.cost_combo._0_4_;
        *(undefined4 *)((long)&pHVar1->cost_combo + 4) = front.cost_combo._4_4_;
        __new_size = __new_size + 1;
      }
      lVar17 = lVar17 + 0x18;
    }
    std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::resize
              (&pairs,__new_size);
    for (uVar18 = 0;
        puVar13 = clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,
        puVar15 = clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        uVar18 < (ulong)((long)clusters.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)clusters.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2); uVar18 = uVar18 + 1)
    {
      CompareAndPushToQueue<brotli::Histogram<256>>
                (out,cluster_size,idx1,
                 clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar18],&pairs);
    }
  } while( true );
}

Assistant:

void HistogramCombine(HistogramType* out,
                      uint32_t* cluster_size,
                      uint32_t* symbols,
                      size_t symbols_size,
                      size_t max_clusters) {
  double cost_diff_threshold = 0.0;
  size_t min_cluster_size = 1;

  // Uniquify the list of symbols.
  std::vector<uint32_t> clusters(symbols, symbols + symbols_size);
  std::sort(clusters.begin(), clusters.end());
  std::vector<uint32_t>::iterator last =
      std::unique(clusters.begin(), clusters.end());
  clusters.resize(static_cast<size_t>(last - clusters.begin()));

  // We maintain a heap of histogram pairs, ordered by the bit cost reduction.
  std::vector<HistogramPair> pairs;
  for (size_t idx1 = 0; idx1 < clusters.size(); ++idx1) {
    for (size_t idx2 = idx1 + 1; idx2 < clusters.size(); ++idx2) {
      CompareAndPushToQueue(out, cluster_size, clusters[idx1], clusters[idx2],
                            &pairs);
    }
  }

  while (clusters.size() > min_cluster_size) {
    if (pairs[0].cost_diff >= cost_diff_threshold) {
      cost_diff_threshold = 1e99;
      min_cluster_size = max_clusters;
      continue;
    }
    // Take the best pair from the top of heap.
    uint32_t best_idx1 = pairs[0].idx1;
    uint32_t best_idx2 = pairs[0].idx2;
    out[best_idx1].AddHistogram(out[best_idx2]);
    out[best_idx1].bit_cost_ = pairs[0].cost_combo;
    cluster_size[best_idx1] += cluster_size[best_idx2];
    for (size_t i = 0; i < symbols_size; ++i) {
      if (symbols[i] == best_idx2) {
        symbols[i] = best_idx1;
      }
    }
    for (std::vector<uint32_t>::iterator cluster = clusters.begin();
         cluster != clusters.end(); ++cluster) {
      if (*cluster >= best_idx2) {
        clusters.erase(cluster);
        break;
      }
    }

    // Remove pairs intersecting the just combined best pair.
    size_t copy_to_idx = 0;
    for (size_t i = 0; i < pairs.size(); ++i) {
      HistogramPair& p = pairs[i];
      if (p.idx1 == best_idx1 || p.idx2 == best_idx1 ||
          p.idx1 == best_idx2 || p.idx2 == best_idx2) {
        // Remove invalid pair from the queue.
        continue;
      }
      if (pairs.front() < p) {
        // Replace the top of the queue if needed.
        HistogramPair front = pairs.front();
        pairs.front() = p;
        pairs[copy_to_idx] = front;
      } else {
        pairs[copy_to_idx] = p;
      }
      ++copy_to_idx;
    }
    pairs.resize(copy_to_idx);

    // Push new pairs formed with the combined histogram to the heap.
    for (size_t i = 0; i < clusters.size(); ++i) {
      CompareAndPushToQueue(out, cluster_size, best_idx1, clusters[i], &pairs);
    }
  }
}